

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XorHandler.h
# Opt level: O3

int __thiscall TCLAP::XorHandler::check(XorHandler *this,Arg *a)

{
  Arg **ppAVar1;
  Arg *pAVar2;
  uint uVar3;
  int iVar4;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_> _Var5;
  ulong uVar6;
  CmdLineParseException *this_00;
  ArgVectorIterator it;
  pointer pvVar7;
  Arg **ppAVar8;
  ulong uVar9;
  Arg **ppAVar10;
  long lVar11;
  Arg *local_78;
  string local_70;
  string local_50;
  
  pvVar7 = (this->_orList).
           super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = a;
  if ((this->_orList).
      super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
    lVar11 = 8;
    uVar9 = 0;
    do {
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<TCLAP::Arg**,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>,__gnu_cxx::__ops::_Iter_equals_val<TCLAP::Arg_const*const>>
                        (*(undefined8 *)((long)pvVar7 + lVar11 + -8),
                         *(undefined8 *)
                          ((long)&(pvVar7->
                                  super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar11),&local_78);
      pvVar7 = (this->_orList).
               super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 = *(Arg ***)((long)&(pvVar7->
                                  super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar11);
      if (_Var5._M_current != ppAVar1) {
        ppAVar8 = *(Arg ***)((long)pvVar7 + lVar11 + -8);
        ppAVar10 = ppAVar8;
        if (ppAVar8 != ppAVar1) {
          do {
            pAVar2 = *ppAVar10;
            if (((local_78 != pAVar2) && (pAVar2->_alreadySet == true)) &&
               (pAVar2->_xorSet == false)) {
              this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,"Mutually exclusive argument already set!","");
              (*(*ppAVar10)->_vptr_Arg[7])(&local_50);
              CmdLineParseException::CmdLineParseException(this_00,&local_70,&local_50);
              __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
            }
            ppAVar10 = ppAVar10 + 1;
          } while (ppAVar10 != ppAVar1);
          for (; ppAVar8 != ppAVar1; ppAVar8 = ppAVar8 + 1) {
            pAVar2 = *ppAVar8;
            if (local_78 != pAVar2) {
              pAVar2->_alreadySet = true;
              pAVar2->_xorSet = true;
            }
          }
        }
        iVar4 = (*(*_Var5._M_current)->_vptr_Arg[0xb])();
        if ((char)iVar4 != '\0') {
          return 0;
        }
        pvVar7 = (this->_orList).
                 super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        return (uint)((ulong)(*(long *)((long)&(pvVar7->
                                               super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start + lVar11)
                             - *(long *)((long)pvVar7 + lVar11 + -8)) >> 3);
      }
      uVar9 = uVar9 + 1;
      uVar6 = ((long)(this->_orList).
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
              -0x5555555555555555;
      lVar11 = lVar11 + 0x18;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
  }
  uVar3 = (*local_78->_vptr_Arg[5])(local_78);
  return uVar3 & 0xff;
}

Assistant:

inline int XorHandler::check( const Arg* a ) 
{
	// iterate over each XOR list
	for ( int i = 0; static_cast<unsigned int>(i) < _orList.size(); i++ )
	{
		// if the XOR list contains the arg..
		ArgVectorIterator ait = std::find( _orList[i].begin(), 
		                                   _orList[i].end(), a );
		if ( ait != _orList[i].end() )
		{
			// first check to see if a mutually exclusive switch
			// has not already been set
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) && (*it)->isSet() )
					throw(CmdLineParseException(
					      "Mutually exclusive argument already set!",
					      (*it)->toString()));

			// go through and set each arg that is not a
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) )
					(*it)->xorSet();

			// return the number of required args that have now been set
			if ( (*ait)->allowMore() )
				return 0;
			else
				return static_cast<int>(_orList[i].size());
		}
	}

	if ( a->isRequired() )
		return 1;
	else
		return 0;
}